

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O2

ares_status_t ares_conn_set_sockaddr(ares_conn_t *conn,sockaddr *sa,ares_socklen_t *salen)

{
  ushort uVar1;
  int iVar2;
  ares_server_t *paVar3;
  undefined8 uVar4;
  
  paVar3 = conn->server;
  uVar1 = *(ushort *)(paVar3->ll_iface + (ulong)((byte)(char)conn->flags & 1) * 2 + -4);
  iVar2 = (paVar3->addr).family;
  if (iVar2 == 10) {
    if (0x1b < *salen) {
      *salen = 0x1c;
      sa->sa_data[2] = '\0';
      sa->sa_data[3] = '\0';
      sa->sa_data[4] = '\0';
      sa->sa_data[5] = '\0';
      sa->sa_data[6] = '\0';
      sa->sa_data[7] = '\0';
      sa->sa_data[8] = '\0';
      sa->sa_data[9] = '\0';
      *(undefined8 *)(sa->sa_data + 10) = 0;
      sa[1].sa_data[2] = '\0';
      sa[1].sa_data[3] = '\0';
      sa[1].sa_data[4] = '\0';
      sa[1].sa_data[5] = '\0';
      sa[1].sa_data[6] = '\0';
      sa[1].sa_data[7] = '\0';
      sa[1].sa_data[8] = '\0';
      sa[1].sa_data[9] = '\0';
      sa->sa_family = 10;
      *(ushort *)sa->sa_data = uVar1 << 8 | uVar1 >> 8;
      uVar4 = *(undefined8 *)((long)&(paVar3->addr).addr + 8);
      *(undefined8 *)(sa->sa_data + 6) = *(undefined8 *)&(paVar3->addr).addr;
      sa[1].sa_family = (short)uVar4;
      sa[1].sa_data[0] = (char)((ulong)uVar4 >> 0x10);
      sa[1].sa_data[1] = (char)((ulong)uVar4 >> 0x18);
      sa[1].sa_data[2] = (char)((ulong)uVar4 >> 0x20);
      sa[1].sa_data[3] = (char)((ulong)uVar4 >> 0x28);
      sa[1].sa_data[4] = (char)((ulong)uVar4 >> 0x30);
      sa[1].sa_data[5] = (char)((ulong)uVar4 >> 0x38);
      *(uint *)(sa[1].sa_data + 6) = paVar3->ll_scope;
      return ARES_SUCCESS;
    }
  }
  else {
    if (iVar2 != 2) {
      return ARES_EBADFAMILY;
    }
    if (0xf < *salen) {
      *salen = 0x10;
      sa->sa_data[10] = '\0';
      sa->sa_data[0xb] = '\0';
      sa->sa_data[0xc] = '\0';
      sa->sa_data[0xd] = '\0';
      sa->sa_data[2] = '\0';
      sa->sa_data[3] = '\0';
      sa->sa_data[4] = '\0';
      sa->sa_data[5] = '\0';
      sa->sa_data[6] = '\0';
      sa->sa_data[7] = '\0';
      sa->sa_data[8] = '\0';
      sa->sa_data[9] = '\0';
      sa->sa_family = 2;
      *(ushort *)sa->sa_data = uVar1 << 8 | uVar1 >> 8;
      *(in_addr_t *)(sa->sa_data + 2) = (paVar3->addr).addr.addr4.s_addr;
      return ARES_SUCCESS;
    }
  }
  return ARES_EFORMERR;
}

Assistant:

static ares_status_t ares_conn_set_sockaddr(const ares_conn_t *conn,
                                            struct sockaddr   *sa,
                                            ares_socklen_t    *salen)
{
  const ares_server_t *server = conn->server;
  unsigned short       port =
    conn->flags & ARES_CONN_FLAG_TCP ? server->tcp_port : server->udp_port;
  struct sockaddr_in  *sin;
  struct sockaddr_in6 *sin6;

  switch (server->addr.family) {
    case AF_INET:
      sin = (struct sockaddr_in *)(void *)sa;
      if (*salen < (ares_socklen_t)sizeof(*sin)) {
        return ARES_EFORMERR;
      }
      *salen = sizeof(*sin);
      memset(sin, 0, sizeof(*sin));
      sin->sin_family = AF_INET;
      sin->sin_port   = htons(port);
      memcpy(&sin->sin_addr, &server->addr.addr.addr4, sizeof(sin->sin_addr));
      return ARES_SUCCESS;
    case AF_INET6:
      sin6 = (struct sockaddr_in6 *)(void *)sa;
      if (*salen < (ares_socklen_t)sizeof(*sin6)) {
        return ARES_EFORMERR;
      }
      *salen = sizeof(*sin6);
      memset(sin6, 0, sizeof(*sin6));
      sin6->sin6_family = AF_INET6;
      sin6->sin6_port   = htons(port);
      memcpy(&sin6->sin6_addr, &server->addr.addr.addr6,
             sizeof(sin6->sin6_addr));
#ifdef HAVE_STRUCT_SOCKADDR_IN6_SIN6_SCOPE_ID
      sin6->sin6_scope_id = server->ll_scope;
#endif
      return ARES_SUCCESS;
    default:
      break;
  }

  return ARES_EBADFAMILY;
}